

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O0

void __thiscall blockchain_tests::get_prune_height::test_method(get_prune_height *this)

{
  bool bVar1;
  CChain *this_00;
  const_string *in_RDI;
  long in_FS_OFFSET;
  BlockManager *blockman;
  int in_stack_00000054;
  CChain *chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  ChainstateManager *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  assertion_result *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff18;
  _Optional_payload_base<int> in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  BlockManager *blockman_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff38;
  const_string local_98;
  CChain *in_stack_ffffffffffffff78;
  BlockManager *in_stack_ffffffffffffff80;
  lazy_ostream local_78 [2];
  assertion_result local_58 [2];
  _Optional_payload_base<int> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff38,(AnnotatedMixin<std::recursive_mutex> *)in_RDI,
             in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffef8);
  this_00 = ChainstateManager::ActiveChain(in_stack_fffffffffffffef8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffef8);
  do {
    blockman_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff08,
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,in_RDI,(size_t)blockman_00,
               (const_string *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff20 =
         (_Optional_payload_base<int>)
         GetPruneHeight(blockman_00,(CChain *)in_stack_ffffffffffffff20);
    local_20 = in_stack_ffffffffffffff20;
    std::optional<int>::has_value((optional<int> *)in_stack_fffffffffffffef8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff08,
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (basic_cstring<const_char> *)in_stack_fffffffffffffef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff08,
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef8 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_58,local_78,&local_98,0x69,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffef8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CheckGetPruneHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_00000054);
  CheckGetPruneHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_00000054);
  CheckGetPruneHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_00000054);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(get_prune_height, TestChain100Setup)
{
    LOCK(::cs_main);
    auto& chain = m_node.chainman->ActiveChain();
    auto& blockman = m_node.chainman->m_blockman;

    // Fresh chain of 100 blocks without any pruned blocks, so std::nullopt should be returned
    BOOST_CHECK(!GetPruneHeight(blockman, chain).has_value());

    // Start pruning
    CheckGetPruneHeight(blockman, chain, 1);
    CheckGetPruneHeight(blockman, chain, 99);
    CheckGetPruneHeight(blockman, chain, 100);
}